

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::transpose(PatternModel *this,int amount)

{
  bool bVar1;
  TransposeCmd *this_00;
  NoteEditCmd *this_01;
  QUndoStack *pQVar2;
  QString local_78;
  NoteEditCmd *local_60;
  NoteEditCmd *cmd_1;
  TrackRow rowcopy;
  TrackRow *rowdata;
  TransposeCmd *local_20;
  TransposeCmd *cmd;
  PatternModel *pPStack_10;
  int amount_local;
  PatternModel *this_local;
  
  if (amount != 0) {
    cmd._4_4_ = amount;
    pPStack_10 = this;
    bVar1 = hasSelection(this);
    if (bVar1) {
      this_00 = (TransposeCmd *)operator_new(0x48);
      TransposeCmd::TransposeCmd(this_00,this,cmd._4_1_);
      local_20 = this_00;
      tr((QString *)&rowdata,"transpose selection",(char *)0x0,-1);
      QUndoCommand::setText((QString *)this_00);
      QString::~QString((QString *)&rowdata);
      pQVar2 = Module::undoStack(this->mModule);
      QUndoStack::push((QUndoCommand *)pQVar2);
    }
    else {
      rowcopy = (TrackRow)cursorTrackRow(this);
      cmd_1 = *(NoteEditCmd **)rowcopy;
      trackerboy::TrackRow::transpose((TrackRow *)&cmd_1,cmd._4_4_);
      if ((uint8_t)cmd_1 != *(char *)rowcopy) {
        this_01 = (NoteEditCmd *)operator_new(0x20);
        NoteEditCmd::TrackEditCmd
                  (this_01,this,(uint8_t)cmd_1,*(uint8_t *)rowcopy,(QUndoCommand *)0x0);
        local_60 = this_01;
        tr(&local_78,"transpose note",(char *)0x0,-1);
        QUndoCommand::setText((QString *)this_01);
        QString::~QString(&local_78);
        pQVar2 = Module::undoStack(this->mModule);
        QUndoStack::push((QUndoCommand *)pQVar2);
      }
    }
  }
  return;
}

Assistant:

void PatternModel::transpose(int amount) {

    if (amount) { // a transpose of 0 does nothing
        if (hasSelection()) {
            auto cmd = new TransposeCmd(*this, (int8_t)amount);
            cmd->setText(tr("transpose selection"));
            mModule.undoStack()->push(cmd);
        } else {
            auto &rowdata = cursorTrackRow();
            auto rowcopy = rowdata;
            rowcopy.transpose(amount);
            // if the transpose resulted in a change, create and push an edit command
            if (rowcopy.note != rowdata.note) {
                auto cmd = new NoteEditCmd(*this, rowcopy.note, rowdata.note);
                cmd->setText(tr("transpose note"));
                mModule.undoStack()->push(cmd);
            }

        }
    }
}